

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_3f6e08::FileSetType::WriteProperties<cmValue>
          (FileSetType *this,cmTarget *tgt,cmTargetInternals *impl,string *prop,cmValue value,
          bool clear)

{
  pointer pcVar1;
  pointer pcVar2;
  pointer pcVar3;
  char *pcVar4;
  cmMakefile *pcVar5;
  string_view sVar6;
  string_view description;
  string_view description_00;
  int iVar7;
  size_type __rlen;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> fileSetName;
  string local_d8;
  string local_b8;
  cmValue local_98;
  undefined1 local_90 [32];
  size_type local_70;
  pointer local_68;
  undefined8 local_60;
  char *local_58;
  size_t local_50;
  char *pcStack_48;
  size_t local_40;
  char *pcStack_38;
  
  pcVar1 = (prop->_M_dataplus)._M_p;
  pcVar2 = (pointer)prop->_M_string_length;
  local_98.Value = value.Value;
  if ((pcVar2 == (pointer)(this->DefaultDirectoryProperty).super_string_view._M_len) &&
     ((pcVar2 == (pointer)0x0 ||
      (iVar7 = bcmp(pcVar1,(this->DefaultDirectoryProperty).super_string_view._M_str,(size_t)pcVar2)
      , iVar7 == 0)))) {
    pcVar4 = (this->TypeName).super_string_view._M_str;
    local_90._0_8_ = local_90 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,pcVar4,pcVar4 + (this->TypeName).super_string_view._M_len);
    cmTargetInternals::AddDirectoryToFileSet<cmValue>
              (impl,tgt,(string *)local_90,local_98,(this->TypeName).super_string_view,
               (this->DefaultDescription).super_string_view,true);
  }
  else {
    if ((pcVar2 != (pointer)(this->DefaultPathProperty).super_string_view._M_len) ||
       ((pcVar2 != (pointer)0x0 &&
        (iVar7 = bcmp(pcVar1,(this->DefaultPathProperty).super_string_view._M_str,(size_t)pcVar2),
        iVar7 != 0)))) {
      local_90._0_8_ = pcVar2;
      local_90._8_8_ = pcVar1;
      iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_90,0,
                         (this->DirectoryPrefix).super_string_view._M_len,
                         (this->DirectoryPrefix).super_string_view);
      if (iVar7 == 0) {
        std::__cxx11::string::substr((ulong)&local_b8,(ulong)prop);
        if (local_b8._M_string_length == 0) {
          pcVar5 = impl->Makefile;
          local_90._0_8_ = (this->ArbitraryDescription).super_string_view._M_len;
          local_90._8_8_ = (this->ArbitraryDescription).super_string_view._M_str;
          local_90._16_8_ = 0x16;
          local_90._24_8_ = " name cannot be empty.";
          views_01._M_len = 2;
          views_01._M_array = (iterator)local_90;
          cmCatViews_abi_cxx11_(&local_d8,views_01);
          cmMakefile::IssueMessage(pcVar5,FATAL_ERROR,&local_d8);
        }
        else {
          sVar6 = (this->TypeName).super_string_view;
          local_90._0_8_ = (this->ArbitraryDescription).super_string_view._M_len;
          local_90._8_8_ = (this->ArbitraryDescription).super_string_view._M_str;
          local_90._16_8_ = 2;
          local_90._24_8_ = (long)"Ignoring extra path from command line:\n \"" + 0x27;
          local_70 = local_b8._M_string_length;
          local_68 = local_b8._M_dataplus._M_p;
          local_60 = 1;
          local_58 = "\"";
          views._M_len = 4;
          views._M_array = (iterator)local_90;
          cmCatViews_abi_cxx11_(&local_d8,views);
          local_40 = local_d8._M_string_length;
          pcStack_38 = local_d8._M_dataplus._M_p;
          description._M_str = local_d8._M_dataplus._M_p;
          description._M_len = local_d8._M_string_length;
          cmTargetInternals::AddDirectoryToFileSet<cmValue>
                    (impl,tgt,&local_b8,local_98,sVar6,description,true);
        }
LAB_001f55f9:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        local_90._8_8_ = (prop->_M_dataplus)._M_p;
        local_90._0_8_ = prop->_M_string_length;
        iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_90,0,
                           (this->PathPrefix).super_string_view._M_len,
                           (this->PathPrefix).super_string_view);
        if (iVar7 == 0) {
          std::__cxx11::string::substr((ulong)&local_b8,(ulong)prop);
          if (local_b8._M_string_length == 0) {
            pcVar5 = impl->Makefile;
            local_90._0_8_ = (this->ArbitraryDescription).super_string_view._M_len;
            local_90._8_8_ = (this->ArbitraryDescription).super_string_view._M_str;
            local_90._16_8_ = 0x16;
            local_90._24_8_ = " name cannot be empty.";
            views_03._M_len = 2;
            views_03._M_array = (iterator)local_90;
            cmCatViews_abi_cxx11_(&local_d8,views_03);
            cmMakefile::IssueMessage(pcVar5,FATAL_ERROR,&local_d8);
          }
          else {
            sVar6 = (this->TypeName).super_string_view;
            local_90._0_8_ = (this->ArbitraryDescription).super_string_view._M_len;
            local_90._8_8_ = (this->ArbitraryDescription).super_string_view._M_str;
            local_90._16_8_ = 2;
            local_90._24_8_ = (long)"Ignoring extra path from command line:\n \"" + 0x27;
            local_70 = local_b8._M_string_length;
            local_68 = local_b8._M_dataplus._M_p;
            local_60 = 1;
            local_58 = "\"";
            views_00._M_len = 4;
            views_00._M_array = (iterator)local_90;
            cmCatViews_abi_cxx11_(&local_d8,views_00);
            local_50 = local_d8._M_string_length;
            pcStack_48 = local_d8._M_dataplus._M_p;
            description_00._M_str = local_d8._M_dataplus._M_p;
            description_00._M_len = local_d8._M_string_length;
            cmTargetInternals::AddPathToFileSet<cmValue>
                      (impl,tgt,&local_b8,local_98,sVar6,description_00,true);
          }
          goto LAB_001f55f9;
        }
        pcVar1 = (prop->_M_dataplus)._M_p;
        pcVar2 = (pointer)prop->_M_string_length;
        pcVar3 = (pointer)(this->SelfEntries).PropertyName.super_string_view._M_len;
        if ((pcVar2 == pcVar3) &&
           ((pcVar4 = (this->SelfEntries).PropertyName.super_string_view._M_str,
            pcVar2 == (pointer)0x0 || (iVar7 = bcmp(pcVar1,pcVar4,(size_t)pcVar2), iVar7 == 0)))) {
          pcVar5 = impl->Makefile;
          local_90._16_8_ = 0x17;
          local_90._24_8_ = (long)"NAME property is read-only\n" + 4;
          views_02._M_len = 2;
          views_02._M_array = (iterator)local_90;
          local_90._0_8_ = pcVar3;
          local_90._8_8_ = pcVar4;
          cmCatViews_abi_cxx11_(&local_b8,views_02);
          cmMakefile::IssueMessage(pcVar5,FATAL_ERROR,&local_b8);
        }
        else {
          pcVar3 = (pointer)(this->InterfaceEntries).PropertyName.super_string_view._M_len;
          if ((pcVar2 != pcVar3) ||
             ((pcVar4 = (this->InterfaceEntries).PropertyName.super_string_view._M_str,
              pcVar2 != (pointer)0x0 && (iVar7 = bcmp(pcVar1,pcVar4,(size_t)pcVar2), iVar7 != 0))))
          {
            return false;
          }
          pcVar5 = impl->Makefile;
          local_90._16_8_ = 0x17;
          local_90._24_8_ = (long)"NAME property is read-only\n" + 4;
          views_04._M_len = 2;
          views_04._M_array = (iterator)local_90;
          local_90._0_8_ = pcVar3;
          local_90._8_8_ = pcVar4;
          cmCatViews_abi_cxx11_(&local_b8,views_04);
          cmMakefile::IssueMessage(pcVar5,FATAL_ERROR,&local_b8);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
        return true;
      }
      goto LAB_001f5627;
    }
    pcVar4 = (this->TypeName).super_string_view._M_str;
    local_90._0_8_ = local_90 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,pcVar4,pcVar4 + (this->TypeName).super_string_view._M_len);
    cmTargetInternals::AddPathToFileSet<cmValue>
              (impl,tgt,(string *)local_90,local_98,(this->TypeName).super_string_view,
               (this->DefaultDescription).super_string_view,true);
  }
  local_b8.field_2._M_allocated_capacity = local_90._16_8_;
  local_b8._M_dataplus._M_p = (pointer)local_90._0_8_;
  if ((undefined1 *)local_90._0_8_ == local_90 + 0x10) {
    return true;
  }
LAB_001f5627:
  operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  return true;
}

Assistant:

bool FileSetType::WriteProperties(cmTarget* tgt, cmTargetInternals* impl,
                                  const std::string& prop, ValueType value,
                                  bool clear)
{
  if (prop == this->DefaultDirectoryProperty) {
    impl->AddDirectoryToFileSet(tgt, std::string(this->TypeName), value,
                                this->TypeName, this->DefaultDescription,
                                clear);
    return true;
  }
  if (prop == this->DefaultPathProperty) {
    impl->AddPathToFileSet(tgt, std::string(this->TypeName), value,
                           this->TypeName, this->DefaultDescription, clear);
    return true;
  }
  if (cmHasPrefix(prop, this->DirectoryPrefix)) {
    auto fileSetName = prop.substr(this->DirectoryPrefix.size());
    if (fileSetName.empty()) {
      impl->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat(this->ArbitraryDescription, " name cannot be empty."));
    } else {
      impl->AddDirectoryToFileSet(
        tgt, fileSetName, value, this->TypeName,
        cmStrCat(this->ArbitraryDescription, " \"", fileSetName, "\""), clear);
    }
    return true;
  }
  if (cmHasPrefix(prop, this->PathPrefix)) {
    auto fileSetName = prop.substr(this->PathPrefix.size());
    if (fileSetName.empty()) {
      impl->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmStrCat(this->ArbitraryDescription, " name cannot be empty."));
    } else {
      impl->AddPathToFileSet(
        tgt, fileSetName, value, this->TypeName,
        cmStrCat(this->ArbitraryDescription, " \"", fileSetName, "\""), clear);
    }
    return true;
  }
  if (prop == this->SelfEntries.PropertyName) {
    impl->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat(this->SelfEntries.PropertyName, " property is read-only\n"));
    return true;
  }
  if (prop == this->InterfaceEntries.PropertyName) {
    impl->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                 cmStrCat(this->InterfaceEntries.PropertyName,
                                          " property is read-only\n"));
    return true;
  }
  return false;
}